

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relivedb.cpp
# Opt level: O1

void __thiscall relive::ReLiveDB::deepFetch(ReLiveDB *this,Stream *stream,bool parentsOnly)

{
  pointer pTVar1;
  pointer pTVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Station *station_00;
  undefined8 uVar3;
  int iVar4;
  long lVar5;
  int64_t *piVar6;
  pointer *__ptr;
  long lVar7;
  _Alloc_hider _Var8;
  unique_ptr<relive::Station,_std::default_delete<relive::Station>_> station;
  _Any_data local_a8;
  pointer local_98;
  order_by_t<long_relive::Track::*> local_88;
  vector<relive::Track,_std::allocator<relive::Track>_> local_58;
  where_t<sqlite_orm::internal::is_equal_t<long_relive::Track::*,_long>_> local_40;
  
  if (stream->_isLiveStream == false) {
    iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->_mutex);
    if (iVar4 != 0) {
      std::__throw_system_error(iVar4);
    }
    if (!parentsOnly) {
      storage_abi_cxx11_();
      local_40.c.super_binary_condition<long_relive::Track::*,_long>.r = stream->_id;
      local_40.c.super_binary_condition<long_relive::Track::*,_long>.l = 8;
      uVar3 = &local_88.super_order_by_base._collate_argument.field_2;
      local_88.super_order_by_base._0_8_ = local_88.super_order_by_base._0_8_ & 0xffffffff00000000;
      local_88.super_order_by_base._collate_argument._M_string_length = 0;
      local_88.super_order_by_base._collate_argument.field_2._M_local_buf[0] = '\0';
      local_88.o = 0x58;
      local_88.super_order_by_base._collate_argument._M_dataplus._M_p = (pointer)uVar3;
      sqlite_orm::internal::storage_t<$86c824a$>::
      get_all<relive::Track,_sqlite_orm::internal::where_t<sqlite_orm::internal::is_equal_t<long_relive::Track::*,_long>_>,_sqlite_orm::internal::order_by_t<long_relive::Track::*>_>
                (&local_58,&storage[abi:cxx11]()::_storage_abi_cxx11_,&local_40,&local_88);
      local_a8._M_unused._M_object =
           (stream->_tracks).super__Vector_base<relive::Track,_std::allocator<relive::Track>_>.
           _M_impl.super__Vector_impl_data._M_start;
      local_a8._8_8_ =
           (stream->_tracks).super__Vector_base<relive::Track,_std::allocator<relive::Track>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      local_98 = (stream->_tracks).super__Vector_base<relive::Track,_std::allocator<relive::Track>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (stream->_tracks).super__Vector_base<relive::Track,_std::allocator<relive::Track>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_58.super__Vector_base<relive::Track,_std::allocator<relive::Track>_>._M_impl.
           super__Vector_impl_data._M_start;
      (stream->_tracks).super__Vector_base<relive::Track,_std::allocator<relive::Track>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_58.super__Vector_base<relive::Track,_std::allocator<relive::Track>_>._M_impl.
           super__Vector_impl_data._M_finish;
      (stream->_tracks).super__Vector_base<relive::Track,_std::allocator<relive::Track>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_58.super__Vector_base<relive::Track,_std::allocator<relive::Track>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_58.super__Vector_base<relive::Track,_std::allocator<relive::Track>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_58.super__Vector_base<relive::Track,_std::allocator<relive::Track>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_58.super__Vector_base<relive::Track,_std::allocator<relive::Track>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<relive::Track,_std::allocator<relive::Track>_>::~vector
                ((vector<relive::Track,_std::allocator<relive::Track>_> *)&local_a8);
      std::vector<relive::Track,_std::allocator<relive::Track>_>::~vector(&local_58);
      if (local_88.super_order_by_base._collate_argument._M_dataplus._M_p != (pointer)uVar3) {
        operator_delete(local_88.super_order_by_base._collate_argument._M_dataplus._M_p,
                        CONCAT71(local_88.super_order_by_base._collate_argument.field_2.
                                 _M_allocated_capacity._1_7_,
                                 local_88.super_order_by_base._collate_argument.field_2._M_local_buf
                                 [0]) + 1);
      }
      pTVar1 = (stream->_tracks).super__Vector_base<relive::Track,_std::allocator<relive::Track>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pTVar2 = (stream->_tracks).super__Vector_base<relive::Track,_std::allocator<relive::Track>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (pTVar1 != pTVar2) {
        lVar5 = ((long)pTVar2 - (long)pTVar1 >> 4) * 0x2e8ba2e8ba2e8ba3 + -1;
        if (lVar5 != 0) {
          piVar6 = &pTVar1[1]._time;
          lVar7 = lVar5;
          do {
            piVar6[-0xe] = *piVar6 - piVar6[-0x16];
            piVar6 = piVar6 + 0x16;
            lVar7 = lVar7 + -1;
          } while (lVar7 != 0);
        }
        pTVar1[lVar5]._duration = stream->_duration - pTVar1[lVar5]._time;
      }
    }
    storage_abi_cxx11_();
    sqlite_orm::internal::storage_t<$86c824a$>::get_pointer<relive::Station,_long>
              ((storage_t<_86c824a_> *)&local_a8,0x3da270);
    if ((Station *)local_a8._M_unused._0_8_ == (Station *)0x0) {
      _Var8._M_p = (pointer)(stream->_station).
                            super___shared_ptr<relive::Station,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi;
      (stream->_station).super___shared_ptr<relive::Station,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (stream->_station).super___shared_ptr<relive::Station,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      local_88.super_order_by_base._0_8_ = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<relive::Station,std::allocator<relive::Station>,relive::Station&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&local_88 + 8),
                 (Station **)&local_88,(allocator<relive::Station> *)&local_58,
                 (Station *)local_a8._M_unused._0_8_);
      _Var8._M_p = local_88.super_order_by_base._collate_argument._M_dataplus._M_p;
      uVar3 = local_88.super_order_by_base._0_8_;
      local_88.super_order_by_base._0_8_ = (Station *)0x0;
      local_88.super_order_by_base._collate_argument._M_dataplus._M_p = (pointer)0x0;
      this_00 = (stream->_station).super___shared_ptr<relive::Station,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      (stream->_station).super___shared_ptr<relive::Station,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)uVar3;
      (stream->_station).super___shared_ptr<relive::Station,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var8._M_p;
      _Var8._M_p = local_88.super_order_by_base._collate_argument._M_dataplus._M_p;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        _Var8._M_p = local_88.super_order_by_base._collate_argument._M_dataplus._M_p;
      }
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var8._M_p !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var8._M_p);
    }
    if ((Station *)local_a8._M_unused._0_8_ != (Station *)0x0) {
      std::default_delete<relive::Station>::operator()
                ((default_delete<relive::Station> *)local_a8._M_pod_data,
                 (Station *)local_a8._M_unused._0_8_);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->_mutex);
  }
  station_00 = (stream->_station).super___shared_ptr<relive::Station,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
  if (station_00 != (Station *)0x0) {
    deepFetch(this,station_00,true);
  }
  return;
}

Assistant:

void ReLiveDB::deepFetch(Stream& stream, bool parentsOnly)
{
    if(!stream._isLiveStream) {
        std::lock_guard<Mutex> lock{_mutex};
        if (!parentsOnly) {
            stream._tracks = storage().get_all<Track>(where(c(&Track::_streamId) == stream._id), order_by(&Track::_time));
            if (!stream._tracks.empty()) {
                for (int i = 0; i < stream._tracks.size() - 1; ++i) {
                    stream._tracks[i]._duration = stream._tracks[i + 1]._time - stream._tracks[i]._time;
                }
                stream._tracks[stream._tracks.size() - 1]._duration = stream._duration - stream._tracks[stream._tracks.size() - 1]._time;
            }
        }
        auto station = storage().get_pointer<Station>(stream._stationId);
        if (station) {
            stream._station = std::make_shared<Station>(*station);
        }
        else {
            stream._station.reset();
        }
    }
    if (stream._station) {
        deepFetch(*stream._station, true);
    }
}